

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O0

ptr<out_of_log_msg> nuraft::out_of_log_msg::deserialize(buffer *buf)

{
  uint64_t uVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer *in_RSI;
  element_type *in_RDI;
  ptr<out_of_log_msg> pVar3;
  uint8_t version;
  buffer_serializer bs;
  ptr<out_of_log_msg> *ret;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  buffer_serializer *in_stack_ffffffffffffffd0;
  
  cs_new<nuraft::out_of_log_msg>();
  buffer_serializer::buffer_serializer((buffer_serializer *)&stack0xffffffffffffffd0,in_RSI,LITTLE);
  buffer_serializer::get_u8
            ((buffer_serializer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  uVar1 = buffer_serializer::get_u64(in_stack_ffffffffffffffd0);
  peVar2 = std::
           __shared_ptr_access<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2df1eb);
  peVar2->start_idx_of_leader_ = uVar1;
  pVar3.super___shared_ptr<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar3.super___shared_ptr<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<out_of_log_msg>)
         pVar3.super___shared_ptr<nuraft::out_of_log_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<out_of_log_msg> out_of_log_msg::deserialize(buffer& buf) {
    ptr<out_of_log_msg> ret = cs_new<out_of_log_msg>();

    buffer_serializer bs(buf);
    uint8_t version = bs.get_u8();
    (void)version;
    ret->start_idx_of_leader_ = bs.get_u64();
    return ret;
}